

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O2

void anon_unknown.dwarf_28759c::writeRead
               (string *tempDir,Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,
               Array2D<float> *pf,int w,int h,int xs,int ys,int dx,int dy)

{
  float fVar1;
  half *phVar2;
  long lVar3;
  int iVar4;
  _Alloc_hider __filename;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint height;
  int iVar9;
  Compression comp;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  Compression *pCVar13;
  undefined4 *puVar14;
  char *pcVar15;
  int *piVar16;
  Box<Imath_3_2::Vec2<int>_> *pBVar17;
  Box<Imath_3_2::Vec2<int>_> *pBVar18;
  float *pfVar19;
  float *pfVar20;
  _Rb_tree_node_base *p_Var21;
  _Rb_tree_node_base *p_Var22;
  _Rb_tree_node_base *p_Var23;
  long lVar24;
  uint *puVar25;
  ulong uVar26;
  uint width;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  uint uVar39;
  long local_200;
  long local_1e8;
  Array2D<Imath_3_2::half> ph2;
  Array2D<unsigned_int> pi2;
  FrameBuffer fb;
  Array2D<float> pf2;
  Header hdr;
  Array2D<Imath_3_2::half> ph4;
  TiledOutputFile out;
  int iStack_a4;
  half *local_98;
  TiledInputFile in;
  string filename;
  
  std::operator+(&filename,tempDir,"imf_test_comp.exr");
  lVar10 = (long)-h;
  lVar11 = (long)-w;
  comp = NO_COMPRESSION;
  do {
    __filename._M_p = filename._M_dataplus._M_p;
    if (comp == NUM_COMPRESSION_METHODS) {
      std::__cxx11::string::~string((string *)&filename);
      return;
    }
    poVar12 = std::operator<<((ostream *)&std::cout,"compression ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,comp);
    std::operator<<(poVar12,":");
    std::ostream::flush();
    _out = 0;
    pi2._sizeX = 0;
    fb._map._M_t._M_impl._0_4_ = w;
    fb._map._M_t._M_impl._4_4_ = h;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = w + 0xaa;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = h + 0x3a;
    Imf_3_2::Header::Header
              (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&pi2,1.0,INCREASING_Y,ZIP_COMPRESSION);
    pCVar13 = (Compression *)Imf_3_2::Header::compression();
    *pCVar13 = comp;
    puVar14 = (undefined4 *)Imf_3_2::Header::lineOrder();
    *puVar14 = 0;
    pcVar15 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&out,UINT,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar15,(Channel *)0x1abe21);
    pcVar15 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar15,(Channel *)0x1abe24);
    pcVar15 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar15,(Channel *)0x1abe27);
    _out = 0xf0000000f;
    Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice
              ((Slice *)&out,UINT,(char *)(pi->_data + pi->_sizeY * lVar10 + lVar11),4,0x2ac,1,1,0.0
               ,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe21);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,HALF,(char *)(ph->_data + ph->_sizeY * lVar10 + lVar11),2,0x156,1,1,0.0
               ,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,FLOAT,(char *)(pf->_data + pf->_sizeY * lVar10 + lVar11),4,0x2ac,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe27);
    std::operator<<((ostream *)&std::cout," writing");
    std::ostream::flush();
    remove(__filename._M_p);
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledOutputFile::TiledOutputFile(&out,__filename._M_p,&hdr,iVar6);
    Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
    iVar8 = (int)(Channel *)&out;
    iVar6 = Imf_3_2::TiledOutputFile::numXTiles(iVar8);
    iVar7 = Imf_3_2::TiledOutputFile::numYTiles(iVar8);
    Imf_3_2::TiledOutputFile::writeTiles(iVar8,0,iVar6 + -1,0,iVar7 + -1);
    Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&fb);
    std::operator<<((ostream *)&std::cout,", reading (whole file)");
    std::ostream::flush();
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledInputFile::TiledInputFile(&in,__filename._M_p,iVar6);
    Imf_3_2::TiledInputFile::header();
    piVar16 = (int *)Imf_3_2::Header::dataWindow();
    iVar6 = piVar16[2];
    lVar33 = (long)*piVar16;
    uVar26 = (iVar6 - lVar33) + 1;
    iVar7 = piVar16[1];
    lVar27 = (long)piVar16[3] - (long)iVar7;
    uVar31 = lVar27 + 1;
    Imf_3_2::Array2D<unsigned_int>::Array2D(&pi2,uVar31,uVar26);
    Imf_3_2::Array2D<Imath_3_2::half>::Array2D(&ph2,uVar31,uVar26);
    Imf_3_2::Array2D<float>::Array2D(&pf2,uVar31,uVar26);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar38 = -(long)iVar7;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice
              ((Slice *)&out,UINT,(char *)(pi2._data + (pi2._sizeY * lVar38 - lVar33)),4,uVar26 * 4,
               1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe21);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,HALF,(char *)(ph2._data + (ph2._sizeY * lVar38 - lVar33)),2,uVar26 * 2,
               1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,FLOAT,(char *)(pf2._data + (lVar38 * pf2._sizeY - lVar33)),4,uVar26 * 4
               ,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe27);
    Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in);
    iVar9 = (int)&in;
    iVar7 = Imf_3_2::TiledInputFile::numXTiles(iVar9);
    iVar8 = Imf_3_2::TiledInputFile::numYTiles(iVar9);
    Imf_3_2::TiledInputFile::readTiles(iVar9,0,iVar7 + -1,0,iVar8 + -1);
    std::operator<<((ostream *)&std::cout,", comparing (whole file)");
    std::ostream::flush();
    Imf_3_2::TiledInputFile::header();
    pBVar17 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
    pBVar18 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
    bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar17,pBVar18);
    if (!bVar5) {
      __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10a,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pBVar17 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    pBVar18 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar17,pBVar18);
    if (!bVar5) {
      __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10b,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar19 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar19;
    pfVar19 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar19) || (NAN(fVar1) || NAN(*pfVar19))) {
      __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10c,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar19 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar20 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar19 != *pfVar20) || (NAN(*pfVar19) || NAN(*pfVar20))) || (pfVar19[1] != pfVar20[1]))
       || (NAN(pfVar19[1]) || NAN(pfVar20[1]))) {
      __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10e,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar19 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar19;
    pfVar19 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar19) || (NAN(fVar1) || NAN(*pfVar19))) {
      __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10f,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar16 = (int *)Imf_3_2::Header::lineOrder();
    iVar7 = *piVar16;
    piVar16 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar7 != *piVar16) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x110,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar16 = (int *)Imf_3_2::Header::compression();
    iVar7 = *piVar16;
    piVar16 = (int *)Imf_3_2::Header::compression();
    if (iVar7 != *piVar16) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x111,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::Header::channels();
    p_Var21 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var22 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var21 == p_Var23) break;
      iVar7 = strcmp((char *)(p_Var21 + 1),(char *)(p_Var22 + 1));
      if (iVar7 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x118,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (p_Var21[9]._M_color != p_Var22[9]._M_color) {
        __assert_fail("hi.channel ().type == ii.channel ().type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x119,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var21[9].field_0x4 != *(int *)&p_Var22[9].field_0x4) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x11a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var21[9]._M_parent != *(int *)&p_Var22[9]._M_parent) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x11b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
      p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
    }
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var21 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var22 != p_Var21) {
      __assert_fail("ii == in.header ().channels ().end ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x121,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    local_200._0_4_ = (int)(iVar6 - lVar33);
    lVar33 = (long)(int)local_200;
    local_1e8._0_4_ = (int)lVar27;
    lVar27 = (long)(int)local_1e8;
    if (comp - B44_COMPRESSION < 4) {
      local_1e8 = 0;
      uVar29 = uVar31 & 0xffffffff;
      lVar38 = 0;
      while( true ) {
        uVar34 = (uint)uVar29;
        uVar32 = 0xf;
        if ((int)uVar34 < 0xf) {
          uVar32 = uVar34;
        }
        if ((int)uVar32 < 1) {
          uVar32 = 0;
        }
        if (lVar27 < lVar38) break;
        height = (int)uVar31 - (int)lVar38;
        if (0xe < (int)height) {
          height = 0xf;
        }
        lVar30 = 0;
        uVar29 = uVar26 & 0xffffffff;
        lVar35 = 0;
        while( true ) {
          uVar37 = (uint)uVar29;
          uVar39 = 0xf;
          if ((int)uVar37 < 0xf) {
            uVar39 = uVar37;
          }
          if ((int)uVar39 < 1) {
            uVar39 = 0;
          }
          if (lVar33 < lVar35) break;
          width = (int)uVar26 - (int)lVar35;
          if (0xe < (int)width) {
            width = 0xf;
          }
          Imf_3_2::Array2D<Imath_3_2::half>::Array2D
                    ((Array2D<Imath_3_2::half> *)&out,(long)(int)height,(long)(int)width);
          Imf_3_2::Array2D<Imath_3_2::half>::Array2D(&ph4,(long)(int)height,(long)(int)width);
          lVar28 = 0;
          lVar24 = local_1e8;
          for (uVar29 = 0; uVar29 != uVar32; uVar29 = uVar29 + 1) {
            phVar2 = ph->_data;
            lVar3 = ph->_sizeY;
            for (uVar36 = 0; uVar39 != uVar36; uVar36 = uVar36 + 1) {
              local_98[uVar36]._h =
                   *(uint16_t *)((long)&phVar2[uVar36]._h + lVar3 * lVar24 + lVar30);
              *(uint16_t *)((long)&ph4._data[uVar36]._h + ph4._sizeY * lVar28) =
                   *(uint16_t *)((long)&ph2._data[uVar36]._h + ph2._sizeY * lVar24 + lVar30);
            }
            lVar28 = lVar28 + 2;
            lVar24 = lVar24 + 2;
          }
          if ((comp & (DWAA_COMPRESSION|B44_COMPRESSION)) == B44_COMPRESSION) {
            compareB44(width,height,(Array2D<Imath_3_2::half> *)&out,&ph4);
          }
          Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&ph4);
          Imf_3_2::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&out);
          lVar35 = lVar35 + 0xf;
          uVar29 = (ulong)(uVar37 - 0xf);
          lVar30 = lVar30 + 0x1e;
        }
        lVar38 = lVar38 + 0xf;
        uVar29 = (ulong)(uVar34 - 0xf);
        local_1e8 = local_1e8 + 0x1e;
      }
    }
    if (lVar33 < 0) {
      lVar33 = -1;
    }
    if (lVar27 < 0) {
      lVar27 = -1;
    }
    lVar38 = 0;
    lVar30 = 0;
    for (lVar35 = 0; lVar35 != lVar27 + 1; lVar35 = lVar35 + 1) {
      lVar24 = 0;
      while (lVar33 + 1 != lVar24) {
        if (*(int *)((long)pi->_data + lVar24 * 4 + pi->_sizeY * lVar38) !=
            *(int *)((long)pi2._data + lVar24 * 4 + pi2._sizeY * lVar38)) {
          __assert_fail("pi1[y][x] == pi2[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                        ,0x14a,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                       );
        }
        if ((comp - NUM_COMPRESSION_METHODS < 0xfffffffc) &&
           ((fVar1 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(uint16_t *)
                                       ((long)&ph->_data[lVar24]._h + ph->_sizeY * lVar30) * 4),
            pfVar19 = (float *)(_imath_half_to_float_table +
                               (ulong)*(uint16_t *)
                                       ((long)&ph2._data[lVar24]._h + ph2._sizeY * lVar30) * 4),
            fVar1 != *pfVar19 || (NAN(fVar1) || NAN(*pfVar19))))) {
          __assert_fail("ph1[y][x] == ph2[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                        ,0x14f,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                       );
        }
        bVar5 = equivalent(*(float *)((long)pf->_data + lVar24 * 4 + pf->_sizeY * lVar38),
                           *(float *)((long)pf2._data + lVar24 * 4 + pf2._sizeY * lVar38),comp);
        lVar24 = lVar24 + 1;
        if (!bVar5) {
          __assert_fail("equivalent (pf1[y][x], pf2[y][x], comp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                        ,0x152,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                       );
        }
      }
      lVar30 = lVar30 + 2;
      lVar38 = lVar38 + 4;
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&fb);
    Imf_3_2::Array2D<float>::~Array2D(&pf2);
    Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&ph2);
    Imf_3_2::Array2D<unsigned_int>::~Array2D(&pi2);
    Imf_3_2::TiledInputFile::~TiledInputFile(&in);
    std::operator<<((ostream *)&std::cout,", reading and comparing (tile-by-tile)");
    std::ostream::flush();
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&ph4,__filename._M_p,iVar6);
    pi2._sizeX = 0xf;
    pi2._sizeY = 0xf;
    puVar25 = (uint *)operator_new__(900);
    ph2._sizeX = 0xf;
    ph2._sizeY = 0xf;
    pi2._data = puVar25;
    ph2._data = (half *)operator_new__(0x1c2);
    pf2._sizeX = 0xf;
    pf2._sizeY = 0xf;
    pf2._data = (float *)operator_new__(900);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice((Slice *)&out,UINT,(char *)puVar25,4,0x3c,1,1,0.0,true,true);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe21);
    Imf_3_2::Slice::Slice((Slice *)&out,HALF,(char *)ph2._data,2,0x1e,1,1,0.0,true,true);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
    Imf_3_2::Slice::Slice((Slice *)&out,FLOAT,(char *)pf2._data,4,0x3c,1,1,0.0,true,true);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe27);
    Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&ph4);
    Imf_3_2::TiledInputFile::header();
    pBVar17 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
    pBVar18 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
    bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar17,pBVar18);
    if (!bVar5) {
      __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18b,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pBVar17 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    pBVar18 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar17,pBVar18);
    if (!bVar5) {
      __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18c,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar19 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar19;
    pfVar19 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar19) || (NAN(fVar1) || NAN(*pfVar19))) {
      __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18d,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar19 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar20 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar19 != *pfVar20) || (NAN(*pfVar19) || NAN(*pfVar20))) || (pfVar19[1] != pfVar20[1]))
       || (NAN(pfVar19[1]) || NAN(pfVar20[1]))) {
      __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,399,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar19 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar19;
    pfVar19 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar19) || (NAN(fVar1) || NAN(*pfVar19))) {
      __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,400,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar16 = (int *)Imf_3_2::Header::lineOrder();
    iVar6 = *piVar16;
    piVar16 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar6 != *piVar16) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x191,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar16 = (int *)Imf_3_2::Header::compression();
    iVar6 = *piVar16;
    piVar16 = (int *)Imf_3_2::Header::compression();
    if (iVar6 != *piVar16) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x192,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::Header::channels();
    p_Var21 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var22 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var21 == p_Var23) break;
      iVar6 = strcmp((char *)(p_Var21 + 1),(char *)(p_Var22 + 1));
      if (iVar6 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x199,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (p_Var21[9]._M_color != p_Var22[9]._M_color) {
        __assert_fail("hi.channel ().type == ii.channel ().type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var21[9].field_0x4 != *(int *)&p_Var22[9].field_0x4) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var21[9]._M_parent != *(int *)&p_Var22[9]._M_parent) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19c,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
      p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
    }
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var21 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var22 != p_Var21) {
      __assert_fail("ii == in.header ().channels ().end ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x1a2,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    iVar6 = 0;
    while( true ) {
      iVar7 = Imf_3_2::TiledInputFile::numYTiles((int)&ph4);
      if (iVar7 <= iVar6) break;
      iVar7 = 0;
      while( true ) {
        iVar9 = (int)&ph4;
        iVar8 = Imf_3_2::TiledInputFile::numXTiles(iVar9);
        if (iVar8 <= iVar7) break;
        Imf_3_2::TiledInputFile::readTile(iVar9,iVar7,iVar6);
        Imf_3_2::TiledInputFile::dataWindowForTile((int)&out,iVar9,iVar7);
        iVar9 = _out - w;
        local_200 = (long)(iStack_a4 - h) * 2;
        lVar33 = (long)(iStack_a4 - h) << 2;
        lVar30 = (long)iVar9 * 4;
        lVar38 = 0;
        lVar27 = 0;
        uVar26 = 0;
        for (iVar8 = iStack_a4; (uVar26 < 0xf && (iVar8 < 1)); iVar8 = iVar8 + 1) {
          iVar4 = _out;
          for (uVar31 = 0; (uVar31 < 0xf && (iVar4 + (int)uVar31 < 1)); uVar31 = uVar31 + 1) {
            if (*(int *)((long)pi->_data + uVar31 * 4 + lVar30 + pi->_sizeY * lVar33) !=
                *(int *)((long)pi2._data + uVar31 * 4 + pi2._sizeY * lVar38)) {
              __assert_fail("pi1[oY + y][oX + x] == pi2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x1b6,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            if ((comp - NUM_COMPRESSION_METHODS < 0xfffffffc) &&
               ((fVar1 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(uint16_t *)
                                           ((long)&ph->_data[(long)iVar9 + uVar31]._h +
                                           ph->_sizeY * local_200) * 4),
                pfVar19 = (float *)(_imath_half_to_float_table +
                                   (ulong)*(uint16_t *)
                                           ((long)&ph2._data[uVar31]._h + ph2._sizeY * lVar27) * 4),
                fVar1 != *pfVar19 || (NAN(fVar1) || NAN(*pfVar19))))) {
              __assert_fail("ph1[oY + y][oX + x] == ph2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x1bd,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            bVar5 = equivalent(*(float *)((long)pf->_data +
                                         uVar31 * 4 + lVar30 + pf->_sizeY * lVar33),
                               *(float *)((long)pf2._data + uVar31 * 4 + pf2._sizeY * lVar38),comp);
            if (!bVar5) {
              __assert_fail("equivalent (pf1[oY + y][oX + x], pf2[y][x], comp)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x1c1,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
          }
          uVar26 = uVar26 + 1;
          lVar27 = lVar27 + 2;
          lVar38 = lVar38 + 4;
          local_200 = local_200 + 2;
          lVar33 = lVar33 + 4;
        }
        iVar7 = iVar7 + 1;
      }
      iVar6 = iVar6 + 1;
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&fb);
    Imf_3_2::Array2D<float>::~Array2D(&pf2);
    Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&ph2);
    Imf_3_2::Array2D<unsigned_int>::~Array2D(&pi2);
    Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph4);
    remove(__filename._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    Imf_3_2::Header::~Header(&hdr);
    comp = comp + RLE_COMPRESSION;
  } while( true );
}

Assistant:

void
writeRead (
    const std::string&           tempDir,
    const Array2D<unsigned int>& pi,
    const Array2D<half>&         ph,
    const Array2D<float>&        pf,
    int                          w,
    int                          h,
    int                          xs,
    int                          ys,
    int                          dx,
    int                          dy)
{
    std::string filename = tempDir + "imf_test_comp.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        writeRead (
            pi,
            ph,
            pf,
            filename.c_str (),
            LineOrder (0),
            w,
            h,
            xs,
            ys,
            dx,
            dy,
            Compression (comp));
    }
}